

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.h
# Opt level: O1

void rapidjson::internal::DigitGen(DiyFp *W,DiyFp *Mp,uint64_t delta,char *buffer,int *len,int *K)

{
  byte bVar1;
  uint64_t uVar2;
  char cVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  bool bVar15;
  
  bVar1 = -(char)Mp->e;
  uVar8 = 1L << (bVar1 & 0x3f);
  uVar7 = Mp->f;
  uVar12 = uVar7 >> (bVar1 & 0x3f);
  uVar2 = W->f;
  uVar10 = 1;
  uVar9 = (uint)uVar12;
  if (((((9 < uVar9) && (uVar10 = 2, 99 < uVar9)) && (uVar10 = 3, 999 < uVar9)) &&
      ((uVar10 = 4, 9999 < uVar9 && (uVar10 = 5, 99999 < uVar9)))) &&
     ((uVar10 = 6, 999999 < uVar9 && (uVar10 = 7, 9999999 < uVar9)))) {
    uVar10 = (ulong)(9 - (uVar9 < 100000000));
  }
  uVar5 = uVar7 - uVar2;
  uVar6 = uVar8 - 1 & uVar7;
  *len = 0;
  do {
    if ((int)uVar10 < 1) {
      uVar9 = 0;
      do {
        uVar7 = delta;
        cVar3 = (char)(uVar6 * 10 >> (bVar1 & 0x3f));
        if ((cVar3 != '\0') || (*len != 0)) {
          iVar11 = *len;
          *len = iVar11 + 1;
          buffer[iVar11] = cVar3 + '0';
        }
        delta = uVar7 * 10;
        uVar6 = uVar6 * 10 & uVar8 - 1;
        uVar9 = uVar9 + 1;
      } while (delta < uVar6 || delta - uVar6 == 0);
      *K = *K - uVar9;
      if ((int)(1 - uVar9) < -0x12) {
        uVar2 = 0;
      }
      else {
        uVar2 = DigitGen::kPow10[uVar9];
      }
      if (uVar8 <= delta - uVar6) {
        uVar5 = uVar2 * uVar5;
        uVar10 = uVar5 - uVar6;
        if (uVar6 <= uVar5 && uVar10 != 0) {
          iVar11 = *len;
          uVar6 = uVar6 + uVar8;
          uVar7 = uVar7 * 10 - uVar6;
          do {
            if ((uVar5 <= uVar6) && (uVar10 <= uVar6 - uVar5)) {
              return;
            }
            buffer[(long)iVar11 + -1] = buffer[(long)iVar11 + -1] + -1;
            bVar15 = uVar8 <= uVar7;
            uVar7 = uVar7 - uVar8;
            if (uVar5 <= uVar6) {
              return;
            }
            uVar10 = uVar10 - uVar8;
            uVar6 = uVar6 + uVar8;
          } while (bVar15);
        }
        return;
      }
      return;
    }
    uVar9 = (int)uVar10 - 1;
    uVar10 = (ulong)uVar9;
    iVar11 = (int)uVar12;
    switch(uVar10) {
    case 0:
      uVar12 = 0;
      goto LAB_0012bc44;
    case 1:
      iVar13 = (int)((uVar12 & 0xffffffff) / 10);
      iVar4 = (int)((uVar12 & 0xffffffff) / 10) * 10;
      break;
    case 2:
      iVar13 = (int)((uVar12 & 0xffffffff) / 100);
      iVar4 = (int)((uVar12 & 0xffffffff) / 100) * 100;
      break;
    case 3:
      iVar13 = (int)((uVar12 & 0xffffffff) / 1000);
      iVar4 = (int)((uVar12 & 0xffffffff) / 1000) * 1000;
      break;
    case 4:
      iVar13 = (int)((uVar12 & 0xffffffff) / 10000);
      iVar4 = (int)((uVar12 & 0xffffffff) / 10000) * 10000;
      break;
    case 5:
      uVar12 = uVar12 >> 5 & 0x7ffffff;
      iVar13 = (int)(uVar12 / 0xc35);
      iVar4 = (int)(uVar12 / 0xc35) * 100000;
      break;
    case 6:
      iVar13 = (int)((uVar12 & 0xffffffff) / 1000000);
      iVar4 = (int)((uVar12 & 0xffffffff) / 1000000) * 1000000;
      break;
    case 7:
      iVar13 = (int)((uVar12 & 0xffffffff) / 10000000);
      iVar4 = (int)((uVar12 & 0xffffffff) / 10000000) * 10000000;
      break;
    case 8:
      iVar13 = (int)((uVar12 & 0xffffffff) / 100000000);
      iVar4 = (int)((uVar12 & 0xffffffff) / 100000000) * 100000000;
      break;
    default:
      iVar11 = 0;
      goto LAB_0012bc44;
    }
    uVar12 = (ulong)(uint)(iVar11 - iVar4);
    iVar11 = iVar13;
LAB_0012bc44:
    if ((iVar11 != 0) || (*len != 0)) {
      iVar4 = *len;
      *len = iVar4 + 1;
      buffer[iVar4] = (char)iVar11 + '0';
    }
    uVar14 = ((uVar12 & 0xffffffff) << (bVar1 & 0x3f)) + uVar6;
    if (uVar14 <= delta) {
      *K = *K + uVar9;
      uVar8 = DigitGen::kPow10[uVar10] << (bVar1 & 0x3f);
      if (uVar5 <= uVar14) {
        return;
      }
      if (delta - uVar14 < uVar8) {
        return;
      }
      iVar11 = *len;
      uVar12 = uVar5 - uVar14;
      uVar14 = uVar14 + uVar8;
      uVar10 = delta - uVar14;
      do {
        if ((uVar5 <= uVar14) && (uVar12 <= (uVar2 - uVar7) + uVar14)) {
          return;
        }
        buffer[(long)iVar11 + -1] = buffer[(long)iVar11 + -1] + -1;
        bVar15 = uVar8 <= uVar10;
        uVar10 = uVar10 - uVar8;
        if (uVar5 <= uVar14) {
          return;
        }
        uVar12 = uVar12 - uVar8;
        uVar14 = uVar14 + uVar8;
      } while (bVar15);
      return;
    }
  } while( true );
}

Assistant:

inline void DigitGen(const DiyFp& W, const DiyFp& Mp, uint64_t delta, char* buffer, int* len, int* K) {
    static const uint64_t kPow10[] = { 1ULL, 10ULL, 100ULL, 1000ULL, 10000ULL, 100000ULL, 1000000ULL, 10000000ULL, 100000000ULL,
                                       1000000000ULL, 10000000000ULL, 100000000000ULL, 1000000000000ULL,
                                       10000000000000ULL, 100000000000000ULL, 1000000000000000ULL,
                                       10000000000000000ULL, 100000000000000000ULL, 1000000000000000000ULL,
                                       10000000000000000000ULL };
    const DiyFp one(uint64_t(1) << -Mp.e, Mp.e);
    const DiyFp wp_w = Mp - W;
    uint32_t p1 = static_cast<uint32_t>(Mp.f >> -one.e);
    uint64_t p2 = Mp.f & (one.f - 1);
    int kappa = CountDecimalDigit32(p1); // kappa in [0, 9]
    *len = 0;

    while (kappa > 0) {
        uint32_t d = 0;
        switch (kappa) {
            case  9: d = p1 /  100000000; p1 %=  100000000; break;
            case  8: d = p1 /   10000000; p1 %=   10000000; break;
            case  7: d = p1 /    1000000; p1 %=    1000000; break;
            case  6: d = p1 /     100000; p1 %=     100000; break;
            case  5: d = p1 /      10000; p1 %=      10000; break;
            case  4: d = p1 /       1000; p1 %=       1000; break;
            case  3: d = p1 /        100; p1 %=        100; break;
            case  2: d = p1 /         10; p1 %=         10; break;
            case  1: d = p1;              p1 =           0; break;
            default:;
        }
        if (d || *len)
            buffer[(*len)++] = static_cast<char>('0' + static_cast<char>(d));
        kappa--;
        uint64_t tmp = (static_cast<uint64_t>(p1) << -one.e) + p2;
        if (tmp <= delta) {
            *K += kappa;
            GrisuRound(buffer, *len, delta, tmp, kPow10[kappa] << -one.e, wp_w.f);
            return;
        }
    }

    // kappa = 0
    for (;;) {
        p2 *= 10;
        delta *= 10;
        char d = static_cast<char>(p2 >> -one.e);
        if (d || *len)
            buffer[(*len)++] = static_cast<char>('0' + d);
        p2 &= one.f - 1;
        kappa--;
        if (p2 < delta) {
            *K += kappa;
            int index = -kappa;
            GrisuRound(buffer, *len, delta, p2, one.f, wp_w.f * (index < 20 ? kPow10[index] : 0));
            return;
        }
    }
}